

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O0

int si9ma::DP::find_way_recursive(int *arr,int length,int start,int aim,int step)

{
  int iVar1;
  int iVar2;
  int step_local;
  int aim_local;
  int start_local;
  int length_local;
  int *arr_local;
  
  if ((((arr == (int *)0x0) || (start < 0)) || (length <= start)) || ((aim < 0 || (length <= aim))))
  {
    arr_local._4_4_ = 0;
  }
  else if (step == 0) {
    arr_local._4_4_ = (uint)(start == aim);
  }
  else if (start == 0) {
    arr_local._4_4_ = find_way_recursive(arr,length,1,aim,step + -1);
  }
  else if (start == length + -1) {
    arr_local._4_4_ = find_way_recursive(arr,length,length + -2,aim,step + -1);
  }
  else {
    iVar1 = find_way_recursive(arr,length,start + 1,aim,step + -1);
    iVar2 = find_way_recursive(arr,length,start + -1,aim,step + -1);
    arr_local._4_4_ = iVar1 + iVar2;
  }
  return arr_local._4_4_;
}

Assistant:

int DP::find_way_recursive(const int *arr, int length,int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        if(step == 0)
            return start == aim;

        if(start == 0)
            return find_way_recursive(arr,length,1,aim,step - 1);

        if(start == length - 1)
            return find_way_recursive(arr,length,length - 2,aim,step - 1);

        return find_way_recursive(arr,length,start + 1,aim,step - 1)
               + find_way_recursive(arr,length,start - 1,aim,step - 1);
    }